

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O2

QString * __thiscall
QtPrivate::QStringList_join
          (QString *__return_storage_ptr__,QtPrivate *this,QStringList *list,QLatin1StringView sep)

{
  qsizetype asize;
  QString *str;
  long lVar1;
  QLatin1StringView str_00;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  if (*(long *)(this + 0x10) != 0) {
    asize = accumulatedSize((QStringList *)this,(qsizetype)sep.m_data);
    QString::reserve(__return_storage_ptr__,asize);
    str = *(QString **)(this + 8);
    lVar1 = *(long *)(this + 0x10) * 0x18;
    while( true ) {
      lVar1 = lVar1 + -0x18;
      QString::append(__return_storage_ptr__,str);
      if (lVar1 == 0) break;
      str = str + 1;
      str_00.m_size = (qsizetype)sep.m_data;
      str_00.m_data = (char *)list;
      QString::append(__return_storage_ptr__,str_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QtPrivate::QStringList_join(const QStringList &list, QLatin1StringView sep)
{
    QString result;
    if (!list.isEmpty()) {
        result.reserve(accumulatedSize(list, sep.size()));
        const auto end = list.end();
        auto it = list.begin();
        result += *it;
        while (++it != end) {
            result += sep;
            result += *it;
        }
    }
    return result;
}